

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuadsPacked
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  deRandom rnd;
  deRandom local_40;
  
  iVar7 = 4;
  if (stride != 0) {
    iVar7 = stride;
  }
  iVar8 = 0;
  iVar10 = iVar7 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar10 = 0;
  }
  pcVar5 = (char *)operator_new__((long)(componentCount + offset + iVar7 * 5 + (count + -1) * iVar10
                                        ));
  deRandom_init(&local_40,seed);
  if (0 < count && primitive == PRIMITIVE_TRIANGLES) {
    uVar6 = (ulong)(uint)count;
    do {
      dVar1 = deRandom_getUint32(&local_40);
      uVar12 = dVar1 % 0x3f6 + 10;
      dVar2 = deRandom_getUint32(&local_40);
      uVar9 = dVar2 % (0x3f6 - dVar1 % 0x3f6) + 10;
      dVar1 = deRandom_getUint32(&local_40);
      dVar2 = deRandom_getUint32(&local_40);
      dVar3 = deRandom_getUint32(&local_40);
      dVar4 = deRandom_getUint32(&local_40);
      uVar11 = (dVar3 % 0x3f6) * 0x100000 + 0xa00000 | dVar4 << 0x1e;
      uVar14 = (dVar1 % 0x3f6) * 0x400 + 0x2800 | uVar11;
      uVar11 = (dVar2 % (0x3f6 - dVar1 % 0x3f6)) * 0x400 + 0x2800 | uVar11;
      uVar15 = uVar14 | uVar9;
      uVar13 = uVar12 | uVar11;
      *(uint *)(pcVar5 + (long)iVar8 + (long)offset) = uVar14 | uVar12;
      *(uint *)(pcVar5 + (long)(iVar7 + iVar8) + (long)offset) = uVar15;
      *(uint *)(pcVar5 + (long)(iVar7 * 2 + iVar8) + (long)offset) = uVar13;
      *(uint *)(pcVar5 + (long)(iVar7 * 3 + iVar8) + (long)offset) = uVar13;
      *(uint *)(pcVar5 + (long)(iVar7 * 4 + iVar8) + (long)offset) = uVar15;
      *(uint *)(pcVar5 + (long)(iVar7 * 5 + iVar8) + (long)offset) = uVar11 | uVar9;
      iVar8 = iVar8 + iVar10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return pcVar5;
}

Assistant:

char* RandomArrayGenerator::createQuadsPacked (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive)
{
	DE_ASSERT(componentCount == 4);
	DE_UNREF(componentCount);
	int quadStride = 0;

	if (stride == 0)
		stride = sizeof(deUint32);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* const _data		= new char[offset + quadStride * (count - 1) + stride * 5 + componentCount * Array::inputTypeSize(Array::INPUTTYPE_INT_2_10_10_10)]; // last element must be fully in the array
	char* const resultData	= _data + offset;

	const deUint32 max		= 1024;
	const deUint32 min		= 10;
	const deUint32 max2		= 4;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			for (int quadNdx = 0; quadNdx < count; quadNdx++)
			{
				deUint32 x1	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 x2	= min + deRandom_getUint32(&rnd) % (max - x1);

				deUint32 y1	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 y2	= min + deRandom_getUint32(&rnd) % (max - y1);

				deUint32 z	= min + deRandom_getUint32(&rnd) % (max - min);
				deUint32 w	= deRandom_getUint32(&rnd) % max2;

				deUint32 val1 = (w << 30) | (z << 20) | (y1 << 10) | x1;
				deUint32 val2 = (w << 30) | (z << 20) | (y1 << 10) | x2;
				deUint32 val3 = (w << 30) | (z << 20) | (y2 << 10) | x1;

				deUint32 val4 = (w << 30) | (z << 20) | (y2 << 10) | x1;
				deUint32 val5 = (w << 30) | (z << 20) | (y1 << 10) | x2;
				deUint32 val6 = (w << 30) | (z << 20) | (y2 << 10) | x2;

				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 0]), val1);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 1]), val2);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 2]), val3);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 3]), val4);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 4]), val5);
				alignmentSafeAssignment<deUint32>(&(resultData[quadNdx * quadStride + stride * 5]), val6);
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}